

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_negx_16_al(void)

{
  uint address;
  uint uVar1;
  uint uVar2;
  uint res;
  uint src;
  uint ea;
  
  address = m68ki_read_imm_32();
  uVar1 = m68ki_read_16_fc(address,m68ki_cpu.s_flag | m68ki_address_space);
  uVar2 = -(m68ki_cpu.x_flag >> 8 & 1) - (uVar1 & 0xffff);
  m68ki_cpu.n_flag = uVar2 >> 8;
  m68ki_cpu.x_flag = uVar2 >> 8;
  m68ki_cpu.v_flag = (uVar1 & uVar2) >> 8;
  m68ki_cpu.not_z_flag = uVar2 & 0xffff | m68ki_cpu.not_z_flag;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  m68ki_write_16_fc(address,m68ki_cpu.s_flag | 1,uVar2 & 0xffff);
  return;
}

Assistant:

static void m68k_op_negx_16_al(void)
{
	uint ea  = EA_AL_16();
	uint src = m68ki_read_16(ea);
	uint res = 0 - MASK_OUT_ABOVE_16(src) - XFLAG_AS_1();

	FLAG_N = NFLAG_16(res);
	FLAG_X = FLAG_C = CFLAG_16(res);
	FLAG_V = (src & res)>>8;

	res = MASK_OUT_ABOVE_16(res);
	FLAG_Z |= res;

	m68ki_write_16(ea, res);
}